

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O0

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  int iVar1;
  uint32_t uVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t in_RDX;
  byte *in_RSI;
  uint32_t in_EDI;
  int c_1;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint32_t tmp;
  uint32_t crc3;
  uint32_t crc2;
  uint32_t crc1;
  uint32_t crc0;
  int c;
  uint8_t *x;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_2c;
  byte *local_20;
  uint32_t local_4;
  
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate),
     iVar1 != 0)) {
    Extend::accelerate = CanAccelerateCRC32C();
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if ((Extend::accelerate & 1U) == 0) {
    pbVar3 = in_RSI + in_RDX;
    local_2c = in_EDI ^ 0xffffffff;
    pbVar4 = anon_unknown_1::RoundUp<4>(in_RSI);
    local_20 = in_RSI;
    if (pbVar4 <= pbVar3) {
      for (; local_20 != pbVar4; local_20 = local_20 + 1) {
        local_2c = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (long)(int)(local_2c & 0xff ^ (uint)*local_20) * 4) ^ local_2c >> 8;
      }
    }
    if (0xf < (long)pbVar3 - (long)local_20) {
      uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d3cd);
      local_40 = uVar2 ^ local_2c;
      local_44 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d3e3);
      local_48 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d3f5);
      local_4c = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d407);
      while (local_20 = local_20 + 0x10, 0xf < (long)pbVar3 - (long)local_20) {
        uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d43e);
        local_40 = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_40 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_40 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_40 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_40 >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d4b5);
        local_44 = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_44 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_44 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_44 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_44 >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d52c);
        local_48 = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_48 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_48 >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_48 >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_48 >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d5a3);
        local_4c = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)(local_4c & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(local_4c >> 8 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(local_4c >> 0x10 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(local_4c >> 0x18) * 4);
      }
      for (; 3 < (long)pbVar3 - (long)local_20; local_20 = local_20 + 4) {
        uVar2 = anon_unknown_1::ReadUint32LE((uint8_t *)0x13d642);
        uVar5 = local_40 & 0xff;
        uVar6 = local_40 >> 8;
        uVar7 = local_40 >> 0x10;
        uVar8 = local_40 >> 0x18;
        local_40 = local_44;
        local_44 = local_48;
        local_48 = local_4c;
        local_4c = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                    (ulong)uVar5 * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                            (ulong)(uVar6 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                            (ulong)(uVar7 & 0xff) * 4) ^
                   *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar8 * 4);
      }
      for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
        local_40 = local_40 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_40 & 0xff) * 4);
      }
      local_44 = local_40 ^ local_44;
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        local_44 = local_44 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_44 & 0xff) * 4);
      }
      local_48 = local_44 ^ local_48;
      for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
        local_48 = local_48 >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_48 & 0xff) * 4);
      }
      local_4c = local_48 ^ local_4c;
      for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
        local_4c = local_4c >> 8 ^
                   *(uint *)((anonymous_namespace)::kByteExtensionTable +
                            (ulong)(local_4c & 0xff) * 4);
      }
      local_2c = local_4c;
    }
    for (; local_20 != pbVar3; local_20 = local_20 + 1) {
      local_2c = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                          (long)(int)(local_2c & 0xff ^ (uint)*local_20) * 4) ^ local_2c >> 8;
    }
    local_4 = local_2c ^ 0xffffffff;
  }
  else {
    local_4 = port::AcceleratedCRC32C(in_EDI,(char *)in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}